

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

VerifySignResponseStruct *
cfd::js::api::ElementsTransactionStructApi::VerifySign
          (VerifySignResponseStruct *__return_storage_ptr__,VerifySignRequestStruct *request)

{
  VerifySignRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  VerifySignRequestStruct *pVStack_18;
  anon_class_1_0_00000001 call_func;
  VerifySignRequestStruct *request_local;
  VerifySignResponseStruct *result;
  
  local_1a = 0;
  pVStack_18 = request;
  VerifySignResponseStruct::VerifySignResponseStruct(__return_storage_ptr__);
  this = pVStack_18;
  std::
  function<cfd::js::api::VerifySignResponseStruct(cfd::js::api::VerifySignRequestStruct_const&)>::
  function<cfd::js::api::ElementsTransactionStructApi::VerifySign(cfd::js::api::VerifySignRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::VerifySignResponseStruct(cfd::js::api::VerifySignRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"VerifySign",&local_129);
  ExecuteStructApi<cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
            ((VerifySignResponseStruct *)(local_108 + 0x20),(api *)this,
             (VerifySignRequestStruct *)local_108,&local_128,in_R8);
  VerifySignResponseStruct::operator=
            (__return_storage_ptr__,(VerifySignResponseStruct *)(local_108 + 0x20));
  VerifySignResponseStruct::~VerifySignResponseStruct
            ((VerifySignResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>::
  ~function((function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
             *)local_108);
  return __return_storage_ptr__;
}

Assistant:

VerifySignResponseStruct ElementsTransactionStructApi::VerifySign(
    const VerifySignRequestStruct& request) {
  auto call_func = [](const VerifySignRequestStruct& request)
      -> VerifySignResponseStruct {  // NOLINT
    VerifySignResponseStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    ElementsAddressFactory address_factory;
    auto utxos = TransactionStructApiBase::ConvertUtxoListForVerify(
        request.txins, &address_factory);
    ctx.CollectInputUtxo(utxos);

    response.success = !utxos.empty();
    for (auto& utxo : utxos) {
      OutPoint outpoint(utxo.txid, utxo.vout);
      try {
        ctx.Verify(outpoint);
      } catch (const CfdException& except) {
        std::string error_msg = std::string(except.what());
        warn(CFD_LOG_SOURCE, "Failed to VerifySign. {}", error_msg);
        response.success = false;
        FailSignTxInStruct fail_data;
        fail_data.txid = outpoint.GetTxid().GetHex();
        fail_data.vout = outpoint.GetVout();
        fail_data.reason = error_msg;
        response.fail_txins.emplace_back(fail_data);
      }
    }

    return response;
  };

  VerifySignResponseStruct result;
  result = ExecuteStructApi<VerifySignRequestStruct, VerifySignResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}